

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefile(cmGlobalUnixMakefileGenerator3 *this)

{
  pointer puVar1;
  cmMakefile *pcVar2;
  cmake *this_00;
  _func_int *p_Var3;
  string *psVar4;
  long lVar5;
  pointer pbVar6;
  cmGlobalUnixMakefileGenerator3 *pcVar7;
  bool bVar8;
  string *psVar9;
  ostream *poVar10;
  ulong uVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  string *outfile;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  pointer puVar12;
  pointer pbVar13;
  cmGlobalUnixMakefileGenerator3 *pcVar14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lfiles;
  string tmpStr;
  string check;
  string makefileName;
  string cmakefileName;
  cmGeneratedFileStream cmakefileStream;
  string local_3a8;
  char *local_388;
  undefined8 local_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  cmGlobalUnixMakefileGenerator3 *local_358;
  _Head_base<0UL,_cmLocalGenerator_*,_false> local_350;
  string local_348;
  LocalGeneratorVector *local_328;
  cmGlobalUnixMakefileGenerator3 *local_320;
  undefined1 local_318 [32];
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  char *local_278;
  undefined8 local_270;
  
  local_298._0_8_ = &local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,"CMAKE_SUPPRESS_REGENERATION","");
  bVar8 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != &local_288) {
    operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
  }
  if (!bVar8) {
    psVar9 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    local_298._8_8_ = (psVar9->_M_dataplus)._M_p;
    local_298._0_8_ = psVar9->_M_string_length;
    local_288._M_allocated_capacity = 0;
    local_288._8_8_ = 0x1a;
    local_278 = "/CMakeFiles/Makefile.cmake";
    local_270 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_298;
    cmCatViews(&local_2d8,views);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,&local_2d8,false,None);
    if ((*(byte *)((long)&local_278 + *(long *)(local_298._0_8_ + -0x18)) & 5) == 0) {
      psVar9 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      local_3a8._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
      local_3a8._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
      local_3a8.field_2._M_allocated_capacity = 0;
      local_3a8.field_2._8_8_ = 9;
      local_388 = "/Makefile";
      local_380 = 0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&local_3a8;
      cmCatViews(&local_2f8,views_00);
      cmLocalUnixMakefileGenerator3::WriteDisclaimer
                ((cmLocalUnixMakefileGenerator3 *)
                 (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                   super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t,(ostream *)local_298);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"# The generator used is:\n",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"set(CMAKE_DEPENDS_GENERATOR \"",0x1d);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
                (&local_3a8,this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,local_3a8._M_dataplus._M_p,
                           local_3a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")\n\n",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar12 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_358 = this;
      if (puVar12 != puVar1) {
        do {
          pcVar2 = ((puVar12->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                    .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_378
                     ,local_378.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      &(pcVar2->ListFiles).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl,
                     (pcVar2->ListFiles).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar1);
      }
      pcVar7 = local_358;
      this_00 = (local_358->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
      bVar8 = cmake::DoWriteGlobVerifyTarget(this_00);
      if (bVar8) {
        psVar9 = cmake::GetGlobVerifyScript_abi_cxx11_(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_378,psVar9);
        psVar9 = cmake::GetGlobVerifyStamp_abi_cxx11_(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_378,psVar9);
      }
      pbVar13 = local_378.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar6 = local_378.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar11 = (long)local_378.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_378.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar5 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                  (local_378.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_378.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                  (pbVar6,pbVar13);
      }
      __first = std::
                __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          (local_378.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_378.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&local_378,(iterator)__first._M_current,
                 (iterator)
                 local_378.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      local_328 = &(pcVar7->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
      local_350._M_head_impl =
           *(cmLocalGenerator **)
            &(((local_328->
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,
                 "# The top level Makefile was generated from the following files:\n",0x41);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"set(CMAKE_MAKEFILE_DEPENDS\n",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"  \"CMakeCache.txt\"\n",0x13);
      pbVar6 = local_378.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar13 = local_378.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  \"",3);
          cmOutputConverter::MaybeRelativeToCurBinDir
                    (&local_3a8,&(local_350._M_head_impl)->super_cmOutputConverter,pbVar13);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_298,local_3a8._M_dataplus._M_p,
                               local_3a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
          }
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 != pbVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  )\n\n",5);
      pcVar7 = local_358;
      psVar9 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((local_358->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      local_3a8._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
      local_3a8._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
      local_3a8.field_2._M_allocated_capacity = 0;
      local_3a8.field_2._8_8_ = 0x1d;
      local_388 = "/CMakeFiles/cmake.check_cache";
      local_380 = 0;
      views_01._M_len = 2;
      views_01._M_array = (iterator)&local_3a8;
      cmCatViews((string *)local_318,views_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"# The corresponding makefile is:\n",0x21);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"set(CMAKE_MAKEFILE_OUTPUTS\n",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  \"",3);
      cmOutputConverter::MaybeRelativeToCurBinDir
                (&local_3a8,&(local_350._M_head_impl)->super_cmOutputConverter,&local_2f8);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,local_3a8._M_dataplus._M_p,
                           local_3a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  \"",3);
      cmOutputConverter::MaybeRelativeToCurBinDir
                (&local_348,&(local_350._M_head_impl)->super_cmOutputConverter,(string *)local_318);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_348._M_dataplus._M_p,local_348._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,
                        CONCAT71(local_348.field_2._M_allocated_capacity._1_7_,
                                 local_348.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  )\n\n",5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"# Byproducts of CMake generate step:\n",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"set(CMAKE_MAKEFILE_PRODUCTS\n",0x1c);
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      local_348._M_string_length = 0;
      local_348.field_2._M_local_buf[0] = '\0';
      pcVar14 = (cmGlobalUnixMakefileGenerator3 *)
                (pcVar7->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_320 = (cmGlobalUnixMakefileGenerator3 *)
                  (pcVar7->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                  super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (pcVar14 != local_320) {
        do {
          p_Var3 = (pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                   _vptr_cmGlobalGenerator[0xe];
          psVar4 = *(string **)(p_Var3 + 0x208);
          local_358 = pcVar14;
          for (psVar9 = *(string **)(p_Var3 + 0x200); pcVar7 = local_358, psVar9 != psVar4;
              psVar9 = psVar9 + 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  \"",3);
            cmOutputConverter::MaybeRelativeToTopBinDir
                      (&local_3a8,&(local_350._M_head_impl)->super_cmOutputConverter,psVar9);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_298,local_3a8._M_dataplus._M_p,
                                 local_3a8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                             ((cmLocalGenerator *)
                              (local_358->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                              _vptr_cmGlobalGenerator);
          local_3a8._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
          local_3a8._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
          local_3a8.field_2._M_allocated_capacity = 0;
          local_3a8.field_2._8_8_ = 0x2b;
          local_388 = "/CMakeFiles/CMakeDirectoryInformation.cmake";
          local_380 = 0;
          views_02._M_len = 2;
          views_02._M_array = (iterator)&local_3a8;
          cmCatViews(&local_2b8,views_02);
          std::__cxx11::string::operator=((string *)&local_348,(string *)&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  \"",3);
          cmOutputConverter::MaybeRelativeToTopBinDir
                    (&local_3a8,
                     (cmOutputConverter *)
                     (pcVar7->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                     _vptr_cmGlobalGenerator,&local_348);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_298,local_3a8._M_dataplus._M_p,
                               local_3a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
          }
          pcVar14 = (cmGlobalUnixMakefileGenerator3 *)
                    &(pcVar7->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                     TryCompileTimeout;
        } while (pcVar14 != local_320);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  )\n\n",5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,
                        CONCAT71(local_348.field_2._M_allocated_capacity._1_7_,
                                 local_348.field_2._M_local_buf[0]) + 1);
      }
      if ((cmGlobalUnixMakefileGenerator3 *)local_318._0_8_ !=
          (cmGlobalUnixMakefileGenerator3 *)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
      }
      WriteMainCMakefileLanguageRules
                ((cmGlobalUnixMakefileGenerator3 *)local_318._0_8_,
                 (cmGeneratedFileStream *)local_298,local_328);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_378);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefile()
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }

  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string cmakefileName =
    cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(),
             "/CMakeFiles/Makefile.cmake");
  cmGeneratedFileStream cmakefileStream(cmakefileName);
  if (!cmakefileStream) {
    return;
  }

  std::string makefileName =
    cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(), "/Makefile");

  {
    // get a local generator for some useful methods
    auto& lg = cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(
      this->LocalGenerators[0]);

    // Write the do not edit header.
    lg.WriteDisclaimer(cmakefileStream);
  }

  // Save the generator name
  cmakefileStream << "# The generator used is:\n"
                  << "set(CMAKE_DEPENDS_GENERATOR \"" << this->GetName()
                  << "\")\n\n";

  // for each cmMakefile get its list of dependencies
  std::vector<std::string> lfiles;
  for (const auto& localGen : this->LocalGenerators) {
    // Get the list of files contributing to this generation step.
    cm::append(lfiles, localGen->GetMakefile()->GetListFiles());
  }

  cmake* cm = this->GetCMakeInstance();
  if (cm->DoWriteGlobVerifyTarget()) {
    lfiles.push_back(cm->GetGlobVerifyScript());
    lfiles.push_back(cm->GetGlobVerifyStamp());
  }

  // Sort the list and remove duplicates.
  std::sort(lfiles.begin(), lfiles.end(), std::less<std::string>());
#if !defined(__VMS) // The Compaq STL on VMS crashes, so accept duplicates.
  auto new_end = std::unique(lfiles.begin(), lfiles.end());
  lfiles.erase(new_end, lfiles.end());
#endif

  {
    // reset lg to the first makefile
    const auto& lg = cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(
      this->LocalGenerators[0]);

    // Save the list to the cmake file.
    cmakefileStream
      << "# The top level Makefile was generated from the following files:\n"
      << "set(CMAKE_MAKEFILE_DEPENDS\n"
      << "  \"CMakeCache.txt\"\n";
    for (std::string const& f : lfiles) {
      cmakefileStream << "  \"" << lg.MaybeRelativeToCurBinDir(f) << "\"\n";
    }
    cmakefileStream << "  )\n\n";

    // Build the path to the cache check file.
    std::string check =
      cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(),
               "/CMakeFiles/cmake.check_cache");

    // Set the corresponding makefile in the cmake file.
    cmakefileStream << "# The corresponding makefile is:\n"
                    << "set(CMAKE_MAKEFILE_OUTPUTS\n"
                    << "  \"" << lg.MaybeRelativeToCurBinDir(makefileName)
                    << "\"\n"
                    << "  \"" << lg.MaybeRelativeToCurBinDir(check) << "\"\n";
    cmakefileStream << "  )\n\n";

    // CMake must rerun if a byproduct is missing.
    cmakefileStream << "# Byproducts of CMake generate step:\n"
                    << "set(CMAKE_MAKEFILE_PRODUCTS\n";

    // add in any byproducts and all the directory information files
    std::string tmpStr;
    for (const auto& localGen : this->LocalGenerators) {
      for (std::string const& outfile :
           localGen->GetMakefile()->GetOutputFiles()) {
        cmakefileStream << "  \"" << lg.MaybeRelativeToTopBinDir(outfile)
                        << "\"\n";
      }
      tmpStr = cmStrCat(localGen->GetCurrentBinaryDirectory(),
                        "/CMakeFiles/CMakeDirectoryInformation.cmake");
      cmakefileStream << "  \"" << localGen->MaybeRelativeToTopBinDir(tmpStr)
                      << "\"\n";
    }
    cmakefileStream << "  )\n\n";
  }

  this->WriteMainCMakefileLanguageRules(cmakefileStream,
                                        this->LocalGenerators);
}